

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

int case_insensitive_strcmp(uchar *string1,uchar *string2)

{
  int iVar1;
  int iVar2;
  byte *local_20;
  uchar *string2_local;
  uchar *string1_local;
  
  if ((string1 == (uchar *)0x0) || (string2 == (uchar *)0x0)) {
    string1_local._4_4_ = 1;
  }
  else {
    local_20 = string2;
    string2_local = string1;
    if (string1 == string2) {
      string1_local._4_4_ = 0;
    }
    else {
      while( true ) {
        iVar1 = tolower((uint)*string2_local);
        iVar2 = tolower((uint)*local_20);
        if (iVar1 != iVar2) break;
        if (*string2_local == '\0') {
          return 0;
        }
        string2_local = string2_local + 1;
        local_20 = local_20 + 1;
      }
      iVar1 = tolower((uint)*string2_local);
      iVar2 = tolower((uint)*local_20);
      string1_local._4_4_ = iVar1 - iVar2;
    }
  }
  return string1_local._4_4_;
}

Assistant:

static int case_insensitive_strcmp(const unsigned char *string1, const unsigned char *string2)
{
    if ((string1 == NULL) || (string2 == NULL))
    {
        return 1;
    }

    if (string1 == string2)
    {
        return 0;
    }

    for(; tolower(*string1) == tolower(*string2); (void)string1++, string2++)
    {
        if (*string1 == '\0')
        {
            return 0;
        }
    }

    return tolower(*string1) - tolower(*string2);
}